

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_2d_agglomeration(REF_MIGRATE ref_migrate)

{
  REF_GRID pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  long local_f8;
  long local_e8;
  long local_e0;
  long local_d0;
  long local_c8;
  long local_b8;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT lose;
  REF_INT keep;
  REF_INT nodes [27];
  REF_INT cell;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MIGRATE ref_migrate_local;
  
  pRVar1 = ref_migrate->grid;
  unique0x00012000 = ref_migrate->grid->node;
  nodes[0x19] = 0;
  do {
    if (pRVar1->cell[10]->max <= nodes[0x19]) {
      return 0;
    }
    RVar2 = ref_cell_nodes(pRVar1->cell[10],nodes[0x19],&lose);
    if (RVar2 == 0) {
      if (((lose < 0) || (stack0xffffffffffffffd8->max <= lose)) ||
         (stack0xffffffffffffffd8->global[lose] < 0)) {
        local_b8 = -1;
      }
      else {
        local_b8 = stack0xffffffffffffffd8->global[lose];
      }
      if (((nodes[1] < 0) || (stack0xffffffffffffffd8->max <= nodes[1])) ||
         (stack0xffffffffffffffd8->global[nodes[1]] < 0)) {
        local_c8 = -1;
      }
      else {
        local_c8 = stack0xffffffffffffffd8->global[nodes[1]];
      }
      if (local_b8 < local_c8) {
        ref_private_macro_code_rss = lose;
        ref_private_macro_code_rss_1 = nodes[1];
      }
      else {
        ref_private_macro_code_rss = nodes[1];
        ref_private_macro_code_rss_1 = lose;
      }
      uVar3 = ref_migrate_2d_agglomeration_keep
                        (ref_migrate,ref_private_macro_code_rss,ref_private_macro_code_rss_1);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0xf2,"ref_migrate_2d_agglomeration",(ulong)uVar3,"0-3");
        return uVar3;
      }
      if (((keep < 0) || (stack0xffffffffffffffd8->max <= keep)) ||
         (stack0xffffffffffffffd8->global[keep] < 0)) {
        local_d0 = -1;
      }
      else {
        local_d0 = stack0xffffffffffffffd8->global[keep];
      }
      if (((nodes[2] < 0) || (stack0xffffffffffffffd8->max <= nodes[2])) ||
         (stack0xffffffffffffffd8->global[nodes[2]] < 0)) {
        local_e0 = -1;
      }
      else {
        local_e0 = stack0xffffffffffffffd8->global[nodes[2]];
      }
      if (local_d0 < local_e0) {
        ref_private_macro_code_rss = keep;
        ref_private_macro_code_rss_1 = nodes[2];
      }
      else {
        ref_private_macro_code_rss = nodes[2];
        ref_private_macro_code_rss_1 = keep;
      }
      uVar3 = ref_migrate_2d_agglomeration_keep
                        (ref_migrate,ref_private_macro_code_rss,ref_private_macro_code_rss_1);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0xfc,"ref_migrate_2d_agglomeration",(ulong)uVar3,"1-4");
        return uVar3;
      }
      if (((nodes[0] < 0) || (stack0xffffffffffffffd8->max <= nodes[0])) ||
         (stack0xffffffffffffffd8->global[nodes[0]] < 0)) {
        local_e8 = -1;
      }
      else {
        local_e8 = stack0xffffffffffffffd8->global[nodes[0]];
      }
      if (((nodes[3] < 0) || (stack0xffffffffffffffd8->max <= nodes[3])) ||
         (stack0xffffffffffffffd8->global[nodes[3]] < 0)) {
        local_f8 = -1;
      }
      else {
        local_f8 = stack0xffffffffffffffd8->global[nodes[3]];
      }
      if (local_e8 < local_f8) {
        ref_private_macro_code_rss = nodes[0];
        ref_private_macro_code_rss_1 = nodes[3];
      }
      else {
        ref_private_macro_code_rss = nodes[3];
        ref_private_macro_code_rss_1 = nodes[0];
      }
      uVar3 = ref_migrate_2d_agglomeration_keep
                        (ref_migrate,ref_private_macro_code_rss,ref_private_macro_code_rss_1);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x106,"ref_migrate_2d_agglomeration",(ulong)uVar3,"2-5");
        return uVar3;
      }
    }
    nodes[0x19] = nodes[0x19] + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_migrate_2d_agglomeration(REF_MIGRATE ref_migrate) {
  REF_GRID ref_grid = ref_migrate_grid(ref_migrate);
  REF_NODE ref_node = ref_grid_node(ref_migrate_grid(ref_migrate));
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT keep, lose;

  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    if (ref_node_global(ref_node, nodes[0]) <
        ref_node_global(ref_node, nodes[3])) {
      keep = nodes[0];
      lose = nodes[3];
    } else {
      keep = nodes[3];
      lose = nodes[0];
    }
    RSS(ref_migrate_2d_agglomeration_keep(ref_migrate, keep, lose), "0-3");

    if (ref_node_global(ref_node, nodes[1]) <
        ref_node_global(ref_node, nodes[4])) {
      keep = nodes[1];
      lose = nodes[4];
    } else {
      keep = nodes[4];
      lose = nodes[1];
    }
    RSS(ref_migrate_2d_agglomeration_keep(ref_migrate, keep, lose), "1-4");

    if (ref_node_global(ref_node, nodes[2]) <
        ref_node_global(ref_node, nodes[5])) {
      keep = nodes[2];
      lose = nodes[5];
    } else {
      keep = nodes[5];
      lose = nodes[2];
    }
    RSS(ref_migrate_2d_agglomeration_keep(ref_migrate, keep, lose), "2-5");
  }

  return REF_SUCCESS;
}